

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
multi_purpose_string_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  char t;
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *pcVar3;
  QDebug *pQVar4;
  _func_function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_MetaConfiguration_ptr_basic_ifstream<char,_std::char_traits<char>_>_ptr_int_ptr
  *local_1e8;
  _func_function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_MetaConfiguration_ptr_basic_ifstream<char,_std::char_traits<char>_>_ptr_int_ptr
  *local_1e0;
  _func_function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_MetaConfiguration_ptr_basic_ifstream<char,_std::char_traits<char>_>_ptr_int_ptr
  *local_140;
  undefined4 local_134;
  QMessageLogger local_130;
  QDebug local_110 [13];
  bool local_103;
  allocator_type local_102;
  char local_101;
  bool qt_category_enabled_1;
  iterator pcStack_100;
  size_type local_f8;
  vector<char,_std::allocator<char>_> local_f0;
  string local_d8;
  QMessageLogger local_b8;
  QDebug local_98 [15];
  bool local_89;
  undefined1 local_88 [7];
  bool qt_category_enabled;
  allocator_type local_56;
  char local_55 [5];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> delimiters;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  builtin_strncpy(local_55,"{[= \n",5);
  local_50 = local_55;
  local_48 = 5;
  delimiters.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = error;
  std::allocator<char>::allocator();
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,__l_00,&local_56);
  std::allocator<char>::~allocator(&local_56);
  read_untill_delimiters_abi_cxx11_
            ((string *)local_88,f,(vector<char,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::operator+=
            ((string *)(anonymous_namespace)::global_string_abi_cxx11_,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  anon_unknown.dwarf_1cea4::trim((string *)(anonymous_namespace)::global_string_abi_cxx11_);
  pQVar2 = parser();
  local_89 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_89 != false) {
    pQVar2 = parser();
    pcVar3 = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_b8,(char *)0x0,0,(char *)0x0,pcVar3);
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(local_98,"string found: ");
    pQVar4 = operator<<(pQVar4,(string *)(anonymous_namespace)::global_string_abi_cxx11_);
    pQVar4 = QDebug::operator<<(pQVar4," next character: ");
    t = std::istream::peek();
    QDebug::operator<<(pQVar4,t);
    QDebug::~QDebug(local_98);
    local_89 = false;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&conf->top_level_class);
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (anonymous_namespace)::global_string_abi_cxx11_,"namespace"), !bVar1))
  {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)(anonymous_namespace)::current_property);
    if (bVar1) {
      local_1e0 = (_func_function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_MetaConfiguration_ptr_basic_ifstream<char,_std::char_traits<char>_>_ptr_int_ptr
                   *)0x0;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)(anonymous_namespace)::current_class);
      if (bVar1) {
        local_1e8 = class_state;
      }
      else {
        local_1e8 = initial_state;
      }
      local_1e0 = local_1e8;
    }
    local_140 = local_1e0;
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(*)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,&local_140);
  }
  else {
    local_101 = '{';
    pcStack_100 = &local_101;
    local_f8 = 1;
    std::allocator<char>::allocator();
    __l._M_len = local_f8;
    __l._M_array = pcStack_100;
    std::vector<char,_std::allocator<char>_>::vector(&local_f0,__l,&local_102);
    read_untill_delimiters_abi_cxx11_(&local_d8,f,&local_f0);
    std::__cxx11::string::operator=((string *)&conf->conf_namespace,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::vector<char,_std::allocator<char>_>::~vector(&local_f0);
    std::allocator<char>::~allocator(&local_102);
    anon_unknown.dwarf_1cea4::trim(&conf->conf_namespace);
    std::istream::ignore();
    std::__cxx11::string::clear();
    pQVar2 = parser();
    local_103 = QLoggingCategory::isDebugEnabled(pQVar2);
    while (local_103 != false) {
      pQVar2 = parser();
      pcVar3 = QLoggingCategory::categoryName(pQVar2);
      QMessageLogger::QMessageLogger(&local_130,(char *)0x0,0,(char *)0x0,pcVar3);
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(local_110,"Setting a namespace");
      operator<<(pQVar4,&conf->conf_namespace);
      QDebug::~QDebug(local_110);
      local_103 = false;
    }
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,initial_state);
  }
  local_134 = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

callback_t multi_purpose_string_state(MetaConfiguration &conf, std::ifstream &f,
                                      int &error) {
  std::vector<char> delimiters = {'{', '[', '=', ' ', '\n'};
  global_string += read_untill_delimiters(f, delimiters);
  trim(global_string);

  qCDebug(parser) << "string found: " << global_string
                  << " next character: " << (char)f.peek();
  if (!conf.top_level_class && global_string == "namespace") {
    conf.conf_namespace = read_untill_delimiters(f, {'{'});
    trim(conf.conf_namespace);

    f.ignore();
    global_string.clear();
    qCDebug(parser) << "Setting a namespace" << conf.conf_namespace;
    return initial_state;
  }

  return current_property ? nullptr // create a state for them.
                          : current_class ? class_state : initial_state;
}